

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O1

void __thiscall
libtorrent::dht_put_alert::dht_put_alert
          (dht_put_alert *this,stack_allocator *param_1,sha1_hash *t,int n)

{
  undefined8 uVar1;
  rep rVar2;
  
  (this->super_alert)._vptr_alert = (_func_int **)&PTR__alert_004ebb50;
  rVar2 = ::std::chrono::_V2::system_clock::now();
  (this->super_alert).m_timestamp.__d.__r = rVar2;
  (this->super_alert)._vptr_alert = (_func_int **)&PTR__dht_put_alert_004ece38;
  uVar1 = *(undefined8 *)((t->m_number)._M_elems + 2);
  *(undefined8 *)(this->target).m_number._M_elems = *(undefined8 *)(t->m_number)._M_elems;
  *(undefined8 *)((this->target).m_number._M_elems + 2) = uVar1;
  (this->target).m_number._M_elems[4] = (t->m_number)._M_elems[4];
  (this->public_key)._M_elems[0] = '\0';
  (this->public_key)._M_elems[1] = '\0';
  (this->public_key)._M_elems[2] = '\0';
  (this->public_key)._M_elems[3] = '\0';
  (this->public_key)._M_elems[4] = '\0';
  (this->public_key)._M_elems[5] = '\0';
  (this->public_key)._M_elems[6] = '\0';
  (this->public_key)._M_elems[7] = '\0';
  (this->public_key)._M_elems[8] = '\0';
  (this->public_key)._M_elems[9] = '\0';
  (this->public_key)._M_elems[10] = '\0';
  (this->public_key)._M_elems[0xb] = '\0';
  (this->public_key)._M_elems[0xc] = '\0';
  (this->public_key)._M_elems[0xd] = '\0';
  (this->public_key)._M_elems[0xe] = '\0';
  (this->public_key)._M_elems[0xf] = '\0';
  (this->public_key)._M_elems[0x10] = '\0';
  (this->public_key)._M_elems[0x11] = '\0';
  (this->public_key)._M_elems[0x12] = '\0';
  (this->public_key)._M_elems[0x13] = '\0';
  (this->public_key)._M_elems[0x14] = '\0';
  (this->public_key)._M_elems[0x15] = '\0';
  (this->public_key)._M_elems[0x16] = '\0';
  (this->public_key)._M_elems[0x17] = '\0';
  (this->public_key)._M_elems[0x18] = '\0';
  (this->public_key)._M_elems[0x19] = '\0';
  (this->public_key)._M_elems[0x1a] = '\0';
  (this->public_key)._M_elems[0x1b] = '\0';
  (this->public_key)._M_elems[0x1c] = '\0';
  (this->public_key)._M_elems[0x1d] = '\0';
  (this->public_key)._M_elems[0x1e] = '\0';
  (this->public_key)._M_elems[0x1f] = '\0';
  (this->signature)._M_elems[0] = '\0';
  (this->signature)._M_elems[1] = '\0';
  (this->signature)._M_elems[2] = '\0';
  (this->signature)._M_elems[3] = '\0';
  (this->signature)._M_elems[4] = '\0';
  (this->signature)._M_elems[5] = '\0';
  (this->signature)._M_elems[6] = '\0';
  (this->signature)._M_elems[7] = '\0';
  (this->signature)._M_elems[8] = '\0';
  (this->signature)._M_elems[9] = '\0';
  (this->signature)._M_elems[10] = '\0';
  (this->signature)._M_elems[0xb] = '\0';
  (this->signature)._M_elems[0xc] = '\0';
  (this->signature)._M_elems[0xd] = '\0';
  (this->signature)._M_elems[0xe] = '\0';
  (this->signature)._M_elems[0xf] = '\0';
  (this->signature)._M_elems[0x10] = '\0';
  (this->signature)._M_elems[0x11] = '\0';
  (this->signature)._M_elems[0x12] = '\0';
  (this->signature)._M_elems[0x13] = '\0';
  (this->signature)._M_elems[0x14] = '\0';
  (this->signature)._M_elems[0x15] = '\0';
  (this->signature)._M_elems[0x16] = '\0';
  (this->signature)._M_elems[0x17] = '\0';
  (this->signature)._M_elems[0x18] = '\0';
  (this->signature)._M_elems[0x19] = '\0';
  (this->signature)._M_elems[0x1a] = '\0';
  (this->signature)._M_elems[0x1b] = '\0';
  (this->signature)._M_elems[0x1c] = '\0';
  (this->signature)._M_elems[0x1d] = '\0';
  (this->signature)._M_elems[0x1e] = '\0';
  (this->signature)._M_elems[0x1f] = '\0';
  (this->signature)._M_elems[0x20] = '\0';
  (this->signature)._M_elems[0x21] = '\0';
  (this->signature)._M_elems[0x22] = '\0';
  (this->signature)._M_elems[0x23] = '\0';
  (this->signature)._M_elems[0x24] = '\0';
  (this->signature)._M_elems[0x25] = '\0';
  (this->signature)._M_elems[0x26] = '\0';
  (this->signature)._M_elems[0x27] = '\0';
  (this->signature)._M_elems[0x28] = '\0';
  (this->signature)._M_elems[0x29] = '\0';
  (this->signature)._M_elems[0x2a] = '\0';
  (this->signature)._M_elems[0x2b] = '\0';
  (this->signature)._M_elems[0x2c] = '\0';
  (this->signature)._M_elems[0x2d] = '\0';
  (this->signature)._M_elems[0x2e] = '\0';
  (this->signature)._M_elems[0x2f] = '\0';
  (this->signature)._M_elems[0x30] = '\0';
  (this->signature)._M_elems[0x31] = '\0';
  (this->signature)._M_elems[0x32] = '\0';
  (this->signature)._M_elems[0x33] = '\0';
  (this->signature)._M_elems[0x34] = '\0';
  (this->signature)._M_elems[0x35] = '\0';
  (this->signature)._M_elems[0x36] = '\0';
  (this->signature)._M_elems[0x37] = '\0';
  (this->signature)._M_elems[0x38] = '\0';
  (this->signature)._M_elems[0x39] = '\0';
  (this->signature)._M_elems[0x3a] = '\0';
  (this->signature)._M_elems[0x3b] = '\0';
  (this->signature)._M_elems[0x3c] = '\0';
  (this->signature)._M_elems[0x3d] = '\0';
  (this->signature)._M_elems[0x3e] = '\0';
  (this->signature)._M_elems[0x3f] = '\0';
  (this->salt)._M_dataplus._M_p = (pointer)&(this->salt).field_2;
  (this->salt)._M_string_length = 0;
  (this->salt).field_2._M_local_buf[0] = '\0';
  this->seq = 0;
  this->num_success = n;
  return;
}

Assistant:

dht_put_alert::dht_put_alert(aux::stack_allocator&, sha1_hash const& t, int n)
		: target(t)
		, public_key()
		, signature()
		, seq(0)
		, num_success(n)
	{}